

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::recombine(TranslateToFuzzReader *this,Function *func)

{
  Random *this_00;
  size_t *this_01;
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  value_type *ppEVar7;
  undefined4 extraout_var;
  TaskFunc p_Var8;
  _Hash_node_base *p_Var9;
  Expression **ppEVar10;
  char *pcVar11;
  __node_base_ptr *pp_Var12;
  ulong uVar13;
  Expression **item;
  undefined1 auStack_268 [8];
  Scanner scanner;
  Modder modder;
  
  this_00 = &this->random;
  bVar4 = Random::oneIn(this_00,2);
  if (!bVar4) {
    scanner.parent =
         (TranslateToFuzzReader *)&scanner.exprsByType.Map._M_h._M_rehash_policy._M_next_resize;
    auStack_268 = (undefined1  [8])0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep =
         (Expression **)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currFunction =
         (Function *)0x0;
    scanner.exprsByType.Map._M_h._M_buckets = (__buckets_ptr)0x1;
    scanner.exprsByType.Map._M_h._M_bucket_count = 0;
    scanner.exprsByType.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    scanner.exprsByType.Map._M_h._M_element_count._0_4_ = 0x3f800000;
    scanner.exprsByType.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    scanner.exprsByType.Map._M_h._M_rehash_policy._4_4_ = 0;
    scanner.exprsByType.Map._M_h._M_rehash_policy._M_next_resize = 0;
    scanner.exprsByType.Map._M_h._M_single_bucket =
         (__node_base_ptr)&scanner.exprsByType.Map._M_h._M_single_bucket;
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currModule =
         (Module *)this;
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)scanner.exprsByType.Map._M_h._M_single_bucket;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_268,
               PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan,&func->body
              );
    while( true ) {
      if (((long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed.
                 _M_elems[9].currp >> 4) +
          (long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep == 0)
      break;
      if ((pointer)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                   .super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
            super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep ==
            (Expression **)0x0) {
          pcVar11 = 
          "T &wasm::SmallVector<wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, 10>::back() [T = wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, N = 10]"
          ;
          goto LAB_001517c8;
        }
        p_Var8 = (TaskFunc)
                 (&(&scanner)[-1].exprsByType.List.
                   super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                   ._M_impl._M_node._M_size)
                 [(long)scanner.
                        super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                        super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                        replacep * 2];
        auStack_268 = (undefined1  [8])
                      scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                      fixed._M_elems
                      [(long)scanner.
                             super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                             .super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                             replacep + -1].func;
        scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
        super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep =
             (Expression **)
             ((long)scanner.
                    super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep +
             -1);
      }
      else {
        p_Var8 = scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_268 = (undefined1  [8])
                      scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
        super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
             super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if ((((pointer)auStack_268)->_M_t).
          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl == (Export *)0x0) {
        pcVar11 = 
        "void wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::walk(Expression *&) [SubType = Scanner, VisitorType = wasm::UnifiedExpressionVisitor<Scanner>]"
        ;
        goto LAB_00151792;
      }
      (*p_Var8)((Scanner *)auStack_268,(Expression **)auStack_268);
    }
    this_01 = &scanner.exprsByType.List.
               super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ._M_impl._M_node._M_size;
    for (p_Var9 = scanner.exprsByType.Map._M_h._M_single_bucket;
        p_Var9 != (_Hash_node_base *)&scanner.exprsByType.Map._M_h._M_single_bucket;
        p_Var9 = p_Var9->_M_nxt) {
      bVar4 = Random::oneIn(this_00,2);
      if (!bVar4) {
        scanner.exprsByType.List.
        super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
        ._M_impl._M_node._M_size = 0;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
             (Expression **)0x0;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.usedFixed = 0;
        uVar5 = Random::upToSquared(this_00,(uint32_t)
                                            ((ulong)((long)p_Var9[4]._M_nxt - (long)p_Var9[3]._M_nxt
                                                    ) >> 3));
        uVar13 = (ulong)uVar5;
        while (bVar4 = uVar13 != 0, uVar13 = uVar13 - 1, bVar4) {
          ppEVar7 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)(p_Var9 + 3));
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_01,
                     ppEVar7);
        }
        if ((Expression **)
            scanner.exprsByType.List.
            super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
            ._M_impl._M_node._M_size ==
            modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep) {
          ppEVar7 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)(p_Var9 + 3));
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_01,
                     ppEVar7);
        }
        p_Var1 = p_Var9[5]._M_nxt;
        p_Var9[5]._M_nxt =
             (_Hash_node_base *)
             modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
             super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.usedFixed;
        p_Var2 = p_Var9[3]._M_nxt;
        p_Var3 = p_Var9[4]._M_nxt;
        p_Var9[3]._M_nxt =
             (_Hash_node_base *)
             scanner.exprsByType.List.
             super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
             ._M_impl._M_node._M_size;
        p_Var9[4]._M_nxt =
             (_Hash_node_base *)
             modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
             super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep;
        scanner.exprsByType.List.
        super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
        ._M_impl._M_node._M_size = (size_t)p_Var2;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
             (Expression **)p_Var3;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.usedFixed =
             (size_t)p_Var1;
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_01)
        ;
      }
    }
    pp_Var12 = &scanner.exprsByType.Map._M_h._M_single_bucket;
    while (pp_Var12 = &(*pp_Var12)->_M_nxt,
          pp_Var12 != &scanner.exprsByType.Map._M_h._M_single_bucket) {
      p_Var1 = ((__node_base_ptr)(pp_Var12 + 4))->_M_nxt;
      for (p_Var9 = ((__node_base_ptr)(pp_Var12 + 3))->_M_nxt; p_Var9 != p_Var1; p_Var9 = p_Var9 + 1
          ) {
        iVar6 = ExpressionManipulator::copy
                          ((EVP_PKEY_CTX *)p_Var9->_M_nxt,(EVP_PKEY_CTX *)this->wasm);
        p_Var9->_M_nxt = (_Hash_node_base *)CONCAT44(extraout_var,iVar6);
      }
    }
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currModule = this->wasm;
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node._M_size = 0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
         (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currFunction =
         (Function *)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    modder.wasm = (Module *)auStack_268;
    modder.scanner = (Scanner *)this;
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)
               &scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size,
               PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::scan,&func->body);
    while( true ) {
      if (((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                 super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                 super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed.
                 _M_elems[9].currp >> 4) +
          (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep == 0)
      break;
      if ((pointer)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
          super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep ==
            (Expression **)0x0) {
          pcVar11 = 
          "T &wasm::SmallVector<wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, 10>::back() [T = wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, N = 10]"
          ;
LAB_001517c8:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar11);
        }
        ppEVar10 = modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed.
                   _M_elems[(long)modder.
                                  super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                  .
                                  super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                  .replacep + -2].currp;
        scanner.exprsByType.List.
        super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
        ._M_impl._M_node._M_size =
             (size_t)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed
                     ._M_elems[(long)modder.
                                     super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                     .
                                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                     .replacep + -1].func;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
             (Expression **)
             ((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep +
             -1);
      }
      else {
        ppEVar10 = (Expression **)
                   modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].func;
        scanner.exprsByType.List.
        super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
        ._M_impl._M_node._M_size =
             (size_t)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
             super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)
           scanner.exprsByType.List.
           super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ._M_impl._M_node._M_size == (Expression *)0x0) {
        pcVar11 = 
        "void wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::walk(Expression *&) [SubType = Modder, VisitorType = wasm::UnifiedExpressionVisitor<Modder>]"
        ;
LAB_00151792:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar11);
      }
      (*(code *)ppEVar10)((Modder *)
                          &scanner.exprsByType.List.
                           super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                           ._M_impl._M_node._M_size,
                          (Expression **)
                          scanner.exprsByType.List.
                          super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                          ._M_impl._M_node._M_size);
    }
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::~Walker
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)
               &scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size);
    recombine::Scanner::~Scanner((Scanner *)auStack_268);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::recombine(Function* func) {
  // Don't always do this.
  if (oneIn(2)) {
    return;
  }
  // First, scan and group all expressions by type.
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    TranslateToFuzzReader& parent;
    // A map of all expressions, categorized by type.
    InsertOrderedMap<Type, std::vector<Expression*>> exprsByType;
    Scanner(TranslateToFuzzReader& parent) : parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }

    std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }
  };
  Scanner scanner(*this);
  scanner.walk(func->body);
  // Potentially trim the list of possible picks, so replacements are more
  // likely to collide.
  for (auto& pair : scanner.exprsByType) {
    if (oneIn(2)) {
      continue;
    }
    auto& list = pair.second;
    std::vector<Expression*> trimmed;
    size_t num = upToSquared(list.size());
    for (size_t i = 0; i < num; i++) {
      trimmed.push_back(pick(list));
    }
    if (trimmed.empty()) {
      trimmed.push_back(pick(list));
    }
    list.swap(trimmed);
  }
  // Replace them with copies, to avoid a copy into one altering another copy
  for (auto& pair : scanner.exprsByType) {
    for (auto*& item : pair.second) {
      item = ExpressionManipulator::copy(item, wasm);
    }
  }
  // Second, with some probability replace an item with another item having
  // a proper type. (This is not always valid due to nesting of labels, but
  // we'll fix that up later.)
  struct Modder : public PostWalker<Modder, UnifiedExpressionVisitor<Modder>> {
    Module& wasm;
    Scanner& scanner;
    TranslateToFuzzReader& parent;

    Modder(Module& wasm, Scanner& scanner, TranslateToFuzzReader& parent)
      : wasm(wasm), scanner(scanner), parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }
  };
  Modder modder(wasm, scanner, *this);
  modder.walk(func->body);
  // TODO: A specific form of recombination we should perhaps do more often is
  //       to recombine among an expression's children, and in particular to
  //       reorder them.
}